

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O2

UBool __thiscall
icu_63::StringCharacterIterator::operator==
          (StringCharacterIterator *this,ForwardCharacterIterator *that)

{
  bool bVar1;
  UBool UVar2;
  
  if (this == (StringCharacterIterator *)that) {
    return '\x01';
  }
  bVar1 = std::type_info::operator!=
                    ((type_info *)
                     (this->super_UCharCharacterIterator).super_CharacterIterator.
                     super_ForwardCharacterIterator.super_UObject._vptr_UObject[-1],
                     (type_info *)(that->super_UObject)._vptr_UObject[-1]);
  if ((((!bVar1) &&
       (UVar2 = UnicodeString::operator==(&this->text,(UnicodeString *)(that + 4)), UVar2 != '\0'))
      && ((this->super_UCharCharacterIterator).super_CharacterIterator.pos ==
          *(int *)((long)&that[1].super_UObject._vptr_UObject + 4))) &&
     ((this->super_UCharCharacterIterator).super_CharacterIterator.begin ==
      *(int *)&that[2].super_UObject._vptr_UObject)) {
    return (this->super_UCharCharacterIterator).super_CharacterIterator.end ==
           *(int *)((long)&that[2].super_UObject._vptr_UObject + 4);
  }
  return '\0';
}

Assistant:

UBool
StringCharacterIterator::operator==(const ForwardCharacterIterator& that) const {
    if (this == &that) {
        return TRUE;
    }

    // do not call UCharCharacterIterator::operator==()
    // because that checks for array pointer equality
    // while we compare UnicodeString objects

    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }

    StringCharacterIterator&    realThat = (StringCharacterIterator&)that;

    return text == realThat.text
        && pos == realThat.pos
        && begin == realThat.begin
        && end == realThat.end;
}